

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O2

void usage(char **argv)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," options");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "This program creates random VPack or JSON structures and validates them. (Default: VPack)"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Available format options are:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," --vpack                create VPack");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout," --json                 create JSON");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --evil                 purposefully fuzz generated VPack, to test for crashes"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --iterations <number>  number of iterations (number > 0). Default: 1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --threads <number>     number of threads (number > 0). Default: 1");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           " --seed <number>        number that will be used as seed for random generation (number >= 0). Default: random value"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

static void usage(char const* argv[]) {
  std::cout << "Usage: " << argv[0] << " options" << std::endl;
  std::cout << "This program creates random VPack or JSON structures and "
               "validates them. (Default: VPack)"
            << std::endl;
  std::cout << "Available format options are:" << std::endl;
  std::cout << " --vpack                create VPack" << std::endl;
  std::cout << " --json                 create JSON" << std::endl;
  std::cout << " --evil                 purposefully fuzz generated VPack, to "
               "test for crashes"
            << std::endl;
  std::cout
      << " --iterations <number>  number of iterations (number > 0). Default: 1"
      << std::endl;
  std::cout
      << " --threads <number>     number of threads (number > 0). Default: 1"
      << std::endl;
  std::cout << " --seed <number>        number that will be used as seed for "
               "random generation (number >= 0). Default: random value"
            << std::endl;
  std::cout << std::endl;
}